

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O1

void __thiscall QMainWindowLayout::restore(QMainWindowLayout *this,bool keepSavedState)

{
  QMainWindowLayout *pQVar1;
  QArrayDataPointer<QDockAreaLayoutItem> *this_00;
  QToolBarAreaLayoutLine *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QDockAreaLayoutItem *pQVar6;
  QArrayDataPointer<QToolBarAreaLayoutLine> *other;
  long lVar7;
  
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    *(undefined8 *)(this + 0x98) = *(undefined8 *)(this + 0x3d0);
    *(undefined8 *)(this + 0x88) = *(undefined8 *)(this + 0x3c0);
    *(undefined8 *)(this + 0x90) = *(undefined8 *)(this + 0x3c8);
    *(undefined8 *)(this + 0xa0) = *(undefined8 *)(this + 0x3d8);
    *(undefined8 *)(this + 0xa8) = *(undefined8 *)(this + 0x3e0);
    *(undefined8 *)(this + 0xb0) = *(undefined8 *)(this + 1000);
    other = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + 0x3f0);
    lVar7 = 4;
    do {
      QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                ((QArrayDataPointer<QToolBarAreaLayoutLine> *)&other[-0x23].size,other);
      pQVar2 = other[1].ptr;
      uVar3 = *(undefined8 *)((long)&other[1].ptr + 1);
      uVar4 = *(undefined8 *)((long)&other[1].size + 1);
      other[-0x22].size = (qsizetype)other[1].d;
      other[-0x21].d = (Data *)pQVar2;
      *(undefined8 *)((long)&other[-0x21].d + 1) = uVar3;
      *(undefined8 *)((long)&other[-0x21].ptr + 1) = uVar4;
      other = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&other[2].ptr;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    this[0x198] = this[0x4d0];
    *(undefined8 *)(this + 0x1a0) = *(undefined8 *)(this + 0x4d8);
    *(undefined8 *)(this + 0x1a8) = *(undefined8 *)(this + 0x4e0);
    *(undefined8 *)(this + 0x1b0) = *(undefined8 *)(this + 0x4e8);
    *(undefined8 *)(this + 0x1b8) = *(undefined8 *)(this + 0x4f0);
    *(undefined8 *)(this + 0x1c0) = *(undefined8 *)(this + 0x4f8);
    *(undefined8 *)(this + 0x1c8) = *(undefined8 *)(this + 0x500);
    *(undefined8 *)(this + 0x1d0) = *(undefined8 *)(this + 0x508);
    *(undefined8 *)(this + 0x1d8) = *(undefined8 *)(this + 0x510);
    lVar7 = 0x1e0;
    do {
      pQVar1 = this + lVar7;
      *(undefined8 *)pQVar1 = *(undefined8 *)(pQVar1 + 0x338);
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)(pQVar1 + 8),
                 (QArrayDataPointer<QWidget_*> *)(this + lVar7 + 0x340));
      uVar3 = *(undefined8 *)(this + lVar7 + 0x360);
      uVar4 = *(undefined8 *)(this + lVar7 + 0x368);
      uVar5 = *(undefined8 *)(this + lVar7 + 0x370);
      *(undefined8 *)(pQVar1 + 0x20) = *(undefined8 *)(this + lVar7 + 0x358);
      *(undefined8 *)(pQVar1 + 0x28) = uVar3;
      *(undefined8 *)(pQVar1 + 0x30) = uVar4;
      *(undefined8 *)(pQVar1 + 0x38) = uVar5;
      this_00 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar7 + 0x40);
      QArrayDataPointer<QDockAreaLayoutItem>::operator=
                (this_00,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar7 + 0x378));
      pQVar6 = *(QDockAreaLayoutItem **)(this + lVar7 + 0x398);
      this_00[1].d = *(Data **)(this + lVar7 + 0x390);
      this_00[1].ptr = pQVar6;
      *(undefined4 *)&this_00[1].size = *(undefined4 *)(this + lVar7 + 0x3a0);
      lVar7 = lVar7 + 0x70;
    } while (lVar7 != 0x3a0);
    this[0x3a4] = this[0x6dc];
    *(undefined4 *)(this + 0x3a0) = *(undefined4 *)(this + 0x6d8);
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)(this + 0x3a8),
               (QArrayDataPointer<QWidget_*> *)(this + 0x6e0));
    applyState(this,(QMainWindowLayoutState *)(this + 0x88),true);
    if (!keepSavedState) {
      QToolBarAreaLayout::clear((QToolBarAreaLayout *)(this + 0x3d8));
      QDockAreaLayout::clear((QDockAreaLayout *)(this + 0x4d8));
      *(undefined8 *)(this + 0x3c0) = 0;
      *(undefined8 *)(this + 0x3c8) = 0xffffffffffffffff;
    }
    QList<int>::clear((QList<int> *)(this + 0x7b0));
    *(undefined8 *)(this + 0x7d8) = 0;
    updateGapIndicator(this);
    return;
  }
  return;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}